

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_restart.c
# Opt level: O2

cupdlp_float
PDHG_Restart_Score_GPU
          (cupdlp_float weightSquared,cupdlp_float dPrimalFeas,cupdlp_float dDualFeas,
          cupdlp_float dDualityGap)

{
  double dVar1;
  
  dVar1 = dDualityGap * dDualityGap +
          weightSquared * dPrimalFeas * dPrimalFeas + (dDualFeas * dDualFeas) / weightSquared;
  if (0.0 <= dVar1) {
    return SQRT(dVar1);
  }
  dVar1 = sqrt(dVar1);
  return dVar1;
}

Assistant:

cupdlp_float PDHG_Restart_Score_GPU(cupdlp_float weightSquared,
                                    cupdlp_float dPrimalFeas,
                                    cupdlp_float dDualFeas,
                                    cupdlp_float dDualityGap) {
  cupdlp_float dScoreGPU = 0.0;

  dScoreGPU =
      sqrt(weightSquared * dPrimalFeas * dPrimalFeas +
           dDualFeas * dDualFeas / weightSquared + dDualityGap * dDualityGap);

  return dScoreGPU;
}